

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorBuilder::ValidateServiceOptions
          (DescriptorBuilder *this,ServiceDescriptor *service,ServiceDescriptorProto *proto)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  FileDescriptor *pFVar4;
  FileOptions *pFVar5;
  string *element_name;
  MethodDescriptorProto *pMVar6;
  int local_24;
  int i;
  ServiceDescriptorProto *proto_local;
  ServiceDescriptor *service_local;
  DescriptorBuilder *this_local;
  
  pFVar4 = ServiceDescriptor::file(service);
  bVar2 = IsLite(pFVar4);
  if (bVar2) {
    pFVar4 = ServiceDescriptor::file(service);
    pFVar5 = FileDescriptor::options(pFVar4);
    bVar2 = FileOptions::cc_generic_services(pFVar5);
    if (!bVar2) {
      pFVar4 = ServiceDescriptor::file(service);
      pFVar5 = FileDescriptor::options(pFVar4);
      bVar2 = FileOptions::java_generic_services(pFVar5);
      if (!bVar2) goto LAB_004e9951;
    }
    element_name = ServiceDescriptor::full_name_abi_cxx11_(service);
    AddError(this,element_name,&proto->super_Message,NAME,
             "Files with optimize_for = LITE_RUNTIME cannot define services unless you set both options cc_generic_services and java_generic_sevices to false."
            );
  }
LAB_004e9951:
  for (local_24 = 0; iVar3 = ServiceDescriptor::method_count(service), local_24 < iVar3;
      local_24 = local_24 + 1) {
    lVar1 = *(long *)(service + 0x28);
    pMVar6 = ServiceDescriptorProto::method(proto,local_24);
    ValidateMethodOptions(this,(MethodDescriptor *)(lVar1 + (long)local_24 * 0x68),pMVar6);
  }
  return;
}

Assistant:

void DescriptorBuilder::ValidateServiceOptions(ServiceDescriptor* service,
    const ServiceDescriptorProto& proto) {
  if (IsLite(service->file()) &&
      (service->file()->options().cc_generic_services() ||
       service->file()->options().java_generic_services())) {
    AddError(service->full_name(), proto,
             DescriptorPool::ErrorCollector::NAME,
             "Files with optimize_for = LITE_RUNTIME cannot define services "
             "unless you set both options cc_generic_services and "
             "java_generic_sevices to false.");
  }

  VALIDATE_OPTIONS_FROM_ARRAY(service, method, Method);
}